

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void __thiscall CPU::WDC65816::ProcessorStorage::set_m_x_flags(ProcessorStorage *this,bool m,bool x)

{
  uint16_t uVar1;
  int iVar2;
  bool x_local;
  bool m_local;
  ProcessorStorage *this_local;
  
  uVar1 = 0xffff;
  if (x) {
    uVar1 = 0xff;
  }
  (this->registers_).x_mask = uVar1;
  iVar2 = 8;
  if (x) {
    iVar2 = 0;
  }
  (this->registers_).x_shift = iVar2;
  (this->registers_).x.full = (this->registers_).x.full & (this->registers_).x_mask;
  (this->registers_).y.full = (this->registers_).y.full & (this->registers_).x_mask;
  uVar1 = 0;
  if (m) {
    uVar1 = 0xff00;
  }
  (this->registers_).m_masks[0] = uVar1;
  uVar1 = 0xffff;
  if (m) {
    uVar1 = 0xff;
  }
  (this->registers_).m_masks[1] = uVar1;
  iVar2 = 8;
  if (m) {
    iVar2 = 0;
  }
  (this->registers_).m_shift = iVar2;
  (this->registers_).mx_flags[0] = m;
  (this->registers_).mx_flags[1] = x;
  return;
}

Assistant:

void ProcessorStorage::set_m_x_flags(bool m, bool x) {
	registers_.x_mask = x ? 0x00ff : 0xffff;
	registers_.x_shift = x ? 0 : 8;
	registers_.x.full &= registers_.x_mask;
	registers_.y.full &= registers_.x_mask;

	registers_.m_masks[0] = m ? 0xff00 : 0x0000;
	registers_.m_masks[1] = m ? 0x00ff : 0xffff;
	registers_.m_shift = m ? 0 : 8;

	// true/1 => 8bit for both flags.
	registers_.mx_flags[0] = m;
	registers_.mx_flags[1] = x;
}